

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface_test.cc
# Opt level: O2

Test * anon_unknown.dwarf_78567::DiskInterfaceTestStatMissingFile::Create(void)

{
  DiskInterfaceTest *this;
  
  this = (DiskInterfaceTest *)operator_new(0x58);
  DiskInterfaceTest::DiskInterfaceTest(this);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__DiskInterfaceTest_001e1fc8;
  g_current_test = (Test *)this;
  return &this->super_Test;
}

Assistant:

TEST_F(DiskInterfaceTest, StatMissingFile) {
  string err;
  EXPECT_EQ(0, disk_.Stat("nosuchfile", &err));
  EXPECT_EQ("", err);

  // On Windows, the errno for a file in a nonexistent directory
  // is different.
  EXPECT_EQ(0, disk_.Stat("nosuchdir/nosuchfile", &err));
  EXPECT_EQ("", err);

  // On POSIX systems, the errno is different if a component of the
  // path prefix is not a directory.
  ASSERT_TRUE(Touch("notadir"));
  EXPECT_EQ(0, disk_.Stat("notadir/nosuchfile", &err));
  EXPECT_EQ("", err);
}